

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTWeather.cpp
# Opt level: O3

void __thiscall LTWeather::Log(LTWeather *this,string *msg)

{
  pointer pcVar1;
  ostream *poVar2;
  size_t sVar3;
  long lVar4;
  char *__s;
  ostringstream lOut;
  char *local_1d8 [2];
  string local_1c8;
  long local_1a8;
  undefined8 local_1a0 [2];
  uint auStack_190 [22];
  ios_base local_138 [264];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
  *(uint *)((long)auStack_190 + *(long *)(local_1a8 + -0x18)) =
       *(uint *)((long)auStack_190 + *(long *)(local_1a8 + -0x18)) & 0xfffffefb | 4;
  *(undefined8 *)((long)local_1a0 + *(long *)(local_1a8 + -0x18)) = 1;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"pos:         ",0xd);
  positionTy::operator_cast_to_string(&local_1c8,&this->pos);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&local_1a8,local_1c8._M_dataplus._M_p,local_1c8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"vis:         ",0xd);
  poVar2 = std::ostream::_M_insert<double>((double)this->visibility_reported_sm);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"sm, ",4);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"sea_pressure: ",0xe);
  poVar2 = std::ostream::_M_insert<double>((double)this->sealevel_pressure_pas);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"pas, ",5);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"sea_temp: ",10);
  poVar2 = std::ostream::_M_insert<double>((double)this->sealevel_temperature_c);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"C, ",3);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"qnh_base_elev: ",0xf);
  poVar2 = std::ostream::_M_insert<double>((double)this->qnh_base_elevation);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"?, ",3);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"qnh_pas:",8);
  poVar2 = std::ostream::_M_insert<double>((double)this->qnh_pas);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,", ",2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"rain: ",6);
  poVar2 = std::ostream::_M_insert<double>((double)(this->rain_percent * 100.0));
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"%,\n",3);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"wind_alt:    ",0xd);
  lVar4 = -0x34;
  do {
    *(undefined8 *)((long)local_1a0 + *(long *)(local_1a8 + -0x18) + 8) = 8;
    poVar2 = std::ostream::_M_insert<double>
                       ((double)*(float *)((long)(this->wind_speed_msc)._M_elems + lVar4));
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
    lVar4 = lVar4 + 4;
  } while (lVar4 != 0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"m\n",2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"wind_speed:  ",0xd);
  lVar4 = -0x34;
  do {
    *(undefined8 *)((long)local_1a0 + *(long *)(local_1a8 + -0x18) + 8) = 8;
    poVar2 = std::ostream::_M_insert<double>
                       ((double)*(float *)((long)(this->wind_direction_degt)._M_elems + lVar4));
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
    lVar4 = lVar4 + 4;
  } while (lVar4 != 0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"kts\n",4);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"wind_dir:    ",0xd);
  lVar4 = -0x34;
  do {
    *(undefined8 *)((long)local_1a0 + *(long *)(local_1a8 + -0x18) + 8) = 8;
    poVar2 = std::ostream::_M_insert<double>
                       ((double)*(float *)((long)(this->shear_speed_msc)._M_elems + lVar4));
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
    lVar4 = lVar4 + 4;
  } while (lVar4 != 0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"deg\n",4);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"shear_speed: ",0xd);
  lVar4 = -0x34;
  do {
    *(undefined8 *)((long)local_1a0 + *(long *)(local_1a8 + -0x18) + 8) = 8;
    poVar2 = std::ostream::_M_insert<double>
                       ((double)*(float *)((long)(this->shear_direction_degt)._M_elems + lVar4));
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
    lVar4 = lVar4 + 4;
  } while (lVar4 != 0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"kts\n",4);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"shear_dir:   ",0xd);
  lVar4 = -0x34;
  do {
    *(undefined8 *)((long)local_1a0 + *(long *)(local_1a8 + -0x18) + 8) = 8;
    poVar2 = std::ostream::_M_insert<double>
                       ((double)*(float *)((long)(this->turbulence)._M_elems + lVar4));
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
    lVar4 = lVar4 + 4;
  } while (lVar4 != 0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"deg\n",4);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"turbulence:  ",0xd);
  lVar4 = -0x34;
  do {
    *(undefined8 *)((long)local_1a0 + *(long *)(local_1a8 + -0x18) + 8) = 8;
    poVar2 = std::ostream::_M_insert<double>
                       ((double)*(float *)((long)(this->dewpoint_deg_c)._M_elems + lVar4));
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
    lVar4 = lVar4 + 4;
  } while (lVar4 != 0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"dewpoint:    ",0xd);
  lVar4 = -0x34;
  do {
    *(undefined8 *)((long)local_1a0 + *(long *)(local_1a8 + -0x18) + 8) = 8;
    poVar2 = std::ostream::_M_insert<double>
                       ((double)*(float *)((long)(this->temperature_altitude_msl_m)._M_elems + lVar4
                                          ));
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
    lVar4 = lVar4 + 4;
  } while (lVar4 != 0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"C\n",2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"temp_alt:    ",0xd);
  lVar4 = -0x34;
  do {
    *(undefined8 *)((long)local_1a0 + *(long *)(local_1a8 + -0x18) + 8) = 8;
    poVar2 = std::ostream::_M_insert<double>
                       ((double)*(float *)((long)(this->temperatures_aloft_deg_c)._M_elems + lVar4))
    ;
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
    lVar4 = lVar4 + 4;
  } while (lVar4 != 0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"m\n",2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"temp:        ",0xd);
  lVar4 = -0x34;
  do {
    *(undefined8 *)((long)local_1a0 + *(long *)(local_1a8 + -0x18) + 8) = 8;
    poVar2 = std::ostream::_M_insert<double>
                       ((double)*(float *)((long)(this->cloud_type)._M_elems + lVar4));
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
    lVar4 = lVar4 + 4;
  } while (lVar4 != 0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"C\n",2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"cloud_type:  ",0xd);
  lVar4 = -0xc;
  do {
    *(undefined8 *)((long)local_1a0 + *(long *)(local_1a8 + -0x18) + 8) = 8;
    poVar2 = std::ostream::_M_insert<double>
                       ((double)*(float *)((long)(this->cloud_coverage_percent)._M_elems + lVar4));
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
    lVar4 = lVar4 + 4;
  } while (lVar4 != 0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1a8,"0=Ci, 1=St, 2=Cu, 3=Cb\n",0x17);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"cloud_cover: ",0xd);
  lVar4 = -0xc;
  do {
    *(undefined8 *)((long)local_1a0 + *(long *)(local_1a8 + -0x18) + 8) = 8;
    poVar2 = std::ostream::_M_insert<double>
                       ((double)(*(float *)((long)(this->cloud_base_msl_m)._M_elems + lVar4) * 100.0
                                ));
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
    lVar4 = lVar4 + 4;
  } while (lVar4 != 0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"%\n",2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"cloud_base:  ",0xd);
  lVar4 = -0xc;
  do {
    *(undefined8 *)((long)local_1a0 + *(long *)(local_1a8 + -0x18) + 8) = 8;
    poVar2 = std::ostream::_M_insert<double>
                       ((double)*(float *)((long)(this->cloud_tops_msl_m)._M_elems + lVar4));
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
    lVar4 = lVar4 + 4;
  } while (lVar4 != 0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"m\n",2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"cloud_tops:  ",0xd);
  lVar4 = -0xc;
  do {
    *(undefined8 *)((long)local_1a0 + *(long *)(local_1a8 + -0x18) + 8) = 8;
    poVar2 = std::ostream::_M_insert<double>
                       ((double)*(float *)((long)(&this->cloud_tops_msl_m + 1) + lVar4));
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
    lVar4 = lVar4 + 4;
  } while (lVar4 != 0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"m\n",2);
  *(undefined8 *)((long)local_1a0 + *(long *)(local_1a8 + -0x18) + 8) = 0;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"tropo_temp:  ",0xd);
  poVar2 = std::ostream::_M_insert<double>((double)this->tropo_temp_c);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"c, ",3);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"tropo_alt: ",0xb);
  poVar2 = std::ostream::_M_insert<double>((double)this->tropo_alt_m);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"m, ",3);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"thermal_rate: ",0xe);
  poVar2 = std::ostream::_M_insert<double>((double)this->thermal_rate_ms);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"m/s, ",5);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"wave_amp: ",10);
  poVar2 = std::ostream::_M_insert<double>((double)this->wave_amplitude);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"m, ",3);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"wave_dir: ",10);
  poVar2 = std::ostream::_M_insert<double>((double)this->wave_dir);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"deg, ",5);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"rwy_fric: ",10);
  poVar2 = (ostream *)std::ostream::operator<<(&local_1a8,this->runway_friction);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,", ",2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"variability: ",0xd);
  poVar2 = std::ostream::_M_insert<double>((double)(this->variability_pct * 100.0));
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"%\n",2);
  if (((-1 < this->change_mode) || (-1 < this->weather_source)) || (-1 < this->weather_preset)) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"immediately: ",0xd);
    poVar2 = std::ostream::_M_insert<bool>(SUB81(&local_1a8,0));
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"change mode: ",0xd);
    poVar2 = (ostream *)std::ostream::operator<<(&local_1a8,this->change_mode);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"source: ",8);
    poVar2 = (ostream *)std::ostream::operator<<(&local_1a8,this->weather_source);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"preset: ",8);
    poVar2 = (ostream *)std::ostream::operator<<(&local_1a8,this->weather_preset);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"METAR: ",7);
  if ((this->metar)._M_string_length == 0) {
    __s = "(nil)";
  }
  else {
    __s = (this->metar)._M_dataplus._M_p;
    if (__s == (pointer)0x0) {
      std::ios::clear((int)local_1d8 + (int)*(undefined8 *)(local_1a8 + -0x18) + 0x30);
      goto LAB_001a0245;
    }
  }
  sVar3 = strlen(__s);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,__s,sVar3);
LAB_001a0245:
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"\n",1);
  if ((int)dataRefs.iLogLevel < 1) {
    pcVar1 = (msg->_M_dataplus)._M_p;
    std::__cxx11::stringbuf::str();
    local_1d8[0] = local_1c8._M_dataplus._M_p;
    LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTWeather.cpp"
           ,0x17e,"Log",logDEBUG,"%s\n%s",pcVar1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
      operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
    }
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void LTWeather::Log (const std::string& msg) const
{
    std::ostringstream lOut;
    lOut << std::fixed << std::setprecision(1);
    lOut <<  "pos:         " << std::string(pos)         << "\n";
    lOut <<  "vis:         " << visibility_reported_sm   << "sm, ";
    lOut <<  "sea_pressure: "<< sealevel_pressure_pas    << "pas, ";
    lOut <<  "sea_temp: "    << sealevel_temperature_c   << "C, ";
    lOut <<  "qnh_base_elev: "<<qnh_base_elevation       << "?, ";
    lOut <<  "qnh_pas:"      << qnh_pas                  << ", ";
    lOut <<  "rain: "        << (rain_percent*100.0f)    << "%,\n";

#define LOG_WARR(label, var, unit)                          \
lOut << label;                                              \
for (const float& f: var) lOut << std::setw(8) << f << " "; \
lOut << unit "\n";
    
    LOG_WARR("wind_alt:    ",   wind_altitude_msl_m,        "m");
    LOG_WARR("wind_speed:  ",   wind_speed_msc,             "kts");
    LOG_WARR("wind_dir:    ",   wind_direction_degt,        "deg");
    LOG_WARR("shear_speed: ",   shear_speed_msc,            "kts");
    LOG_WARR("shear_dir:   ",   shear_direction_degt,       "deg");
    LOG_WARR("turbulence:  ",   turbulence,                 "");
    LOG_WARR("dewpoint:    ",   dewpoint_deg_c,             "C");
    LOG_WARR("temp_alt:    ",   temperature_altitude_msl_m, "m");
    LOG_WARR("temp:        ",   temperatures_aloft_deg_c,   "C");
    LOG_WARR("cloud_type:  ",   cloud_type,                 "0=Ci, 1=St, 2=Cu, 3=Cb");
    lOut <<  "cloud_cover: ";
    for (const float& f: cloud_coverage_percent) lOut << std::setw(8) << (f*100.0f) << " ";
    lOut <<  "%\n";
    LOG_WARR("cloud_base:  ",   cloud_base_msl_m,           "m");
    LOG_WARR("cloud_tops:  ",   cloud_tops_msl_m,           "m");
    lOut << std::setw(0);

    lOut <<  "tropo_temp:  " << tropo_temp_c             << "c, ";
    lOut <<  "tropo_alt: "   << tropo_alt_m              << "m, ";
    lOut <<  "thermal_rate: "<< thermal_rate_ms          << "m/s, ";
    lOut <<  "wave_amp: "    << wave_amplitude           << "m, ";
    lOut <<  "wave_dir: "    << wave_dir                 << "deg, ";
    lOut <<  "rwy_fric: "    << runway_friction          << ", ";
    lOut <<  "variability: " << (variability_pct*100.0f) << "%\n";
    
    // if any of the follow is filled (e.g. after getting weather from X-Plane for logging purposes)
    if (change_mode >= 0 || weather_source >= 0 || weather_preset >= 0) {
        lOut << "immediately: " << update_immediately << ", ";
        lOut << "change mode: " << change_mode << ", ";
        lOut << "source: " << weather_source << ", ";
        lOut << "preset: " << weather_preset << "\n";
    }
    
    lOut <<  "METAR: "       << (metar.empty() ? "(nil)" : metar.c_str()) << "\n";

    LOG_MSG(logDEBUG, "%s\n%s", msg.c_str(), lOut.str().c_str());
}